

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O1

bool __thiscall
gl4cts::DirectStateAccess::Textures::StorageAndSubImageTest::TextureSubImage<1u,false>
          (StorageAndSubImageTest *this,GLenum target,GLuint texture,GLint level,
          GLint internalformat,GLsizei width,GLsizei height,GLsizei depth,GLenum format,GLenum type,
          GLvoid *data)

{
  RenderContext *pRVar1;
  int iVar2;
  deUint32 err;
  undefined4 extraout_var;
  undefined4 in_register_0000000c;
  undefined4 in_register_00000014;
  undefined4 in_register_00000034;
  undefined4 in_register_00000084;
  
  pRVar1 = ((this->super_TestCase).m_context)->m_renderCtx;
  iVar2 = (*pRVar1->_vptr_RenderContext[3])
                    (pRVar1,CONCAT44(in_register_00000034,target),
                     CONCAT44(in_register_00000014,texture),CONCAT44(in_register_0000000c,level),
                     CONCAT44(in_register_00000084,internalformat));
  (**(code **)(CONCAT44(extraout_var,iVar2) + 0x13b0))(target,level,0,width,format,type,data);
  err = (**(code **)(CONCAT44(extraout_var,iVar2) + 0x800))();
  glu::checkError(err,"glTexSubImage1D has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x7ee);
  return true;
}

Assistant:

bool StorageAndSubImageTest::TextureSubImage<1, false>(glw::GLenum target, glw::GLuint texture, glw::GLint level,
													   glw::GLint internalformat, glw::GLsizei width,
													   glw::GLsizei height, glw::GLsizei depth, glw::GLenum format,
													   glw::GLenum type, const glw::GLvoid* data)
{
	(void)texture;
	(void)internalformat;
	(void)height;
	(void)depth;
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Action. */
	gl.texSubImage1D(target, level, 0, width, format, type, data);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTexSubImage1D has failed");

	/* TextureStorage* (not TextureSubImage) is tested so here we only throw when error occurs. */
	return true;
}